

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestNestedGroupExtensionInnerExtension::ByteSizeLong
          (TestNestedGroupExtensionInnerExtension *this)

{
  uint32_t *puVar1;
  size_t sVar2;
  string_view sVar3;
  WireFormatLite *local_38;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestNestedGroupExtensionInnerExtension *this_;
  TestNestedGroupExtensionInnerExtension *this_local;
  
  sStack_20 = 0;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    sVar3 = _internal_inner_name(this);
    local_38 = (WireFormatLite *)sVar3._M_len;
    sVar3._M_len = (size_t)sVar3._M_str;
    sStack_20 = google::protobuf::internal::WireFormatLite::StringSize(local_38,sVar3);
    sStack_20 = sStack_20 + 1;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestNestedGroupExtensionInnerExtension::ByteSizeLong() const {
  const TestNestedGroupExtensionInnerExtension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestNestedGroupExtensionInnerExtension)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // string inner_name = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_inner_name());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}